

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall tinyusdz::PrimSpec::PrimSpec(PrimSpec *this,PrimSpec *rhs)

{
  PrimSpec *rhs_local;
  PrimSpec *this_local;
  
  this->_specifier = Def;
  ::std::__cxx11::string::string((string *)&this->_typeName);
  ::std::__cxx11::string::string((string *)&this->_name);
  ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::vector(&this->_children);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
         *)&this->_props);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->_current_vsmap);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  ::map(&this->_variantSets);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector(&this->_primChildren);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector(&this->_properties);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector(&this->_variantChildren);
  PrimMetas::PrimMetas(&this->_metas);
  ::std::__cxx11::string::string((string *)&this->_current_working_path);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->_asset_search_paths);
  if (this != rhs) {
    CopyFrom(this,rhs);
  }
  return;
}

Assistant:

PrimSpec(const PrimSpec &rhs) {
    if (this != &rhs) {
      CopyFrom(rhs);
    }
  }